

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::HasItem(RecyclableObject *object,uint64 index)

{
  uint64 instance;
  PropertyId propertyId;
  BOOL BVar1;
  ScriptContext *scriptContext_00;
  ScriptContext *scriptContext;
  PropertyRecord *propertyRecord;
  uint64 index_local;
  RecyclableObject *object_local;
  
  scriptContext = (ScriptContext *)0x0;
  propertyRecord = (PropertyRecord *)index;
  index_local = (uint64)object;
  scriptContext_00 = RecyclableObject::GetScriptContext(object);
  GetPropertyIdForInt((uint64)propertyRecord,scriptContext_00,(PropertyRecord **)&scriptContext);
  instance = index_local;
  propertyId = PropertyRecord::GetPropertyId((PropertyRecord *)scriptContext);
  BVar1 = HasProperty((RecyclableObject *)instance,propertyId);
  return BVar1;
}

Assistant:

BOOL JavascriptOperators::HasItem(RecyclableObject* object, uint64 index)
    {
        PropertyRecord const * propertyRecord = nullptr;
        ScriptContext* scriptContext = object->GetScriptContext();
        JavascriptOperators::GetPropertyIdForInt(index, scriptContext, &propertyRecord);
        return JavascriptOperators::HasProperty(object, propertyRecord->GetPropertyId());
    }